

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::MixTexture::writeTo(MixTexture *this,BinaryWriter *binary)

{
  int32_t local_4c;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_28,&(this->map_amount).
                       super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>);
  local_4c = BinaryWriter::serialize(binary,(SP *)local_28);
  BinaryWriter::write<int>(binary,&local_4c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_38,&(this->tex1).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>);
  local_4c = BinaryWriter::serialize(binary,(SP *)local_38);
  BinaryWriter::write<int>(binary,&local_4c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_48,&(this->tex2).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>);
  local_4c = BinaryWriter::serialize(binary,(SP *)local_48);
  BinaryWriter::write<int>(binary,&local_4c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->scale1);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->scale2);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->amount);
  return 0x27;
}

Assistant:

int MixTexture::writeTo(BinaryWriter &binary) 
  {
    Texture::writeTo(binary);
    binary.write(binary.serialize(map_amount));
    binary.write(binary.serialize(tex1));
    binary.write(binary.serialize(tex2));
    binary.write(scale1);
    binary.write(scale2);
    binary.write(amount);
    return TYPE_MIX_TEXTURE;
  }